

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O0

void multiple_perform_undo_proc(Am_Object *undo_handler)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object old_command;
  Am_Value local_50;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object last_command;
  undefined1 local_20 [8];
  Am_Value_List command_list;
  Am_Object *undo_handler_local;
  
  command_list.item = (Am_List_Item *)undo_handler;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  pAVar2 = Am_Object::Get(undo_handler,0xc5,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,pAVar2);
  bVar1 = Am_Value_List::Empty((Am_Value_List *)local_20);
  if (bVar1) {
    Am_Error("Command list is empty for Multiple Undo Handler");
  }
  Am_Value_List::Start((Am_Value_List *)local_20);
  Am_Object::Am_Object(&local_38);
  pAVar2 = Am_Value_List::Get((Am_Value_List *)local_20);
  Am_Object::operator=(&local_38,pAVar2);
  Am_Value_List::Delete((Am_Value_List *)local_20,false);
  Am_Value::Am_Value(&local_50,&Am_No_Value);
  Am_Value::Am_Value((Am_Value *)&old_command,&Am_No_Value);
  am_perform_on_cmd_and_impls
            (&local_40,(Am_Slot_Key)&local_38,true,(Am_Value *)0x0,&local_50,SUB81(&old_command,0));
  Am_Object::~Am_Object(&local_40);
  Am_Value::~Am_Value((Am_Value *)&old_command);
  Am_Value::~Am_Value(&local_50);
  Am_Object::Am_Object(&local_68);
  pAVar2 = Am_Object::Get(undo_handler,0x17a,0);
  Am_Object::operator=(&local_68,pAVar2);
  bVar1 = Am_Object::Valid(&local_68);
  if (bVar1) {
    Am_Object::Am_Object(&local_70,&local_68);
    destroy_command_tree(&local_70);
    Am_Object::~Am_Object(&local_70);
  }
  value = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Object::Set(undo_handler,0x17a,value,0);
  Am_Object::Note_Changed(undo_handler,0xc5);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, multiple_perform_undo,
                 (Am_Object undo_handler))
{
  Am_Value_List command_list;
  command_list = undo_handler.Get(Am_COMMAND);
  if (command_list.Empty())
    Am_Error("Command list is empty for Multiple Undo Handler");
  else { // undo the current item and all its Am_IMPLEMENTATION_CHILD
    command_list.Start();
    Am_Object last_command;
    last_command = command_list.Get();
    // false so don't copy the list
    command_list.Delete(false); // pop it from the undo list
    // now do the undo action
    am_perform_on_cmd_and_impls(last_command, Am_UNDO_METHOD);

    // remember the command in case Redo
    Am_Object old_command;
    old_command = undo_handler.Get(Am_LAST_UNDONE_COMMAND);
    // destroy any old one saved there
    if (old_command.Valid())
      destroy_command_tree(old_command);
    // now save the new last_command
    undo_handler.Set(Am_LAST_UNDONE_COMMAND, last_command);
    undo_handler.Note_Changed(Am_COMMAND); //destructively modified value
  }
}